

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge_return_pass.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::MergeReturnPass::AddSingleCaseSwitchAroundFunction(MergeReturnPass *this)

{
  bool bVar1;
  CFG *this_00;
  
  CreateReturnBlock(this);
  CreateReturn(this,this->final_return_block_);
  if ((((this->super_MemPass).super_Pass.context_)->valid_analyses_ & kAnalysisCFG) != kAnalysisNone
     ) {
    this_00 = Pass::cfg((Pass *)this);
    CFG::RegisterBlock(this_00,this->final_return_block_);
  }
  bVar1 = CreateSingleCaseSwitch(this,this->final_return_block_);
  return bVar1;
}

Assistant:

bool MergeReturnPass::AddSingleCaseSwitchAroundFunction() {
  CreateReturnBlock();
  CreateReturn(final_return_block_);

  if (context()->AreAnalysesValid(IRContext::kAnalysisCFG)) {
    cfg()->RegisterBlock(final_return_block_);
  }

  if (!CreateSingleCaseSwitch(final_return_block_)) {
    return false;
  }
  return true;
}